

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMeans.cpp
# Opt level: O1

void __thiscall KMeans::modelToQueries(KMeans *this)

{
  pointer *pppAVar1;
  pointer *pppVar2;
  _WordT *p_Var3;
  iterator iVar4;
  pointer ppAVar5;
  _WordT _Var6;
  Aggregate *pAVar7;
  Query *pQVar8;
  iterator __position;
  vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>> *this_00;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  Aggregate *agg_1;
  Aggregate *agg;
  Aggregate *local_118;
  Aggregate *local_110;
  vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>> *local_108
  ;
  vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>> *local_100
  ;
  KMeans *local_f8;
  bitset<1500UL> local_f0;
  
  pAVar7 = (Aggregate *)operator_new(0x30);
  (pAVar7->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar7->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar7->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pAVar7->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar7->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar7->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_110 = pAVar7;
  memset(&local_f0,0,0xc0);
  iVar4._M_current =
       (pAVar7->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (pAVar7->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
    _M_realloc_insert<std::bitset<1500ul>>
              ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar7,iVar4,
               &local_f0);
  }
  else {
    memset(iVar4._M_current,0,0xc0);
    (pAVar7->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  pQVar8 = (Query *)operator_new(0x30);
  (pQVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pQVar8->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pQVar8->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (pQVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppAVar5 = (pQVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar5 == (pointer)0x0) {
    std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
              ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar8->_aggregates,(iterator)0x0,
               &local_110);
  }
  else {
    *ppAVar5 = local_110;
    pppAVar1 = &(pQVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  pQVar8->_rootID =
       ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
       ->_id;
  _Var6 = (this->clusterVariables).super__Base_bitset<2UL>._M_w[1];
  (pQVar8->_fVars).super__Base_bitset<2UL>._M_w[0] =
       (this->clusterVariables).super__Base_bitset<2UL>._M_w[0];
  (pQVar8->_fVars).super__Base_bitset<2UL>._M_w[1] = _Var6;
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pQVar8);
  local_100 = (vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>>
               *)&this->categoricalQueries;
  local_108 = (vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>>
               *)&this->continuousQueries;
  uVar9 = 0;
  countQuery = pQVar8;
  local_f8 = this;
  do {
    uVar11 = uVar9 >> 6;
    uVar10 = 1L << ((byte)uVar9 & 0x3f);
    if (((this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[uVar11] >> (uVar9 & 0x3f)
        & 1) != 0) {
      pAVar7 = (Aggregate *)operator_new(0x30);
      (pAVar7->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar7->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar7->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pAVar7->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar7->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar7->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118 = pAVar7;
      memset((pair<unsigned_long,_Query_*> *)&local_f0,0,0xc0);
      iVar4._M_current =
           (pAVar7->_agg).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (pAVar7->_agg).
          super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
        _M_realloc_insert<std::bitset<1500ul>>
                  ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar7,iVar4,
                   &local_f0);
      }
      else {
        memset(iVar4._M_current,0,0xc0);
        (pAVar7->_agg).
        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      pQVar8 = (Query *)operator_new(0x30);
      this = local_f8;
      (pQVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pQVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pQVar8->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
      (pQVar8->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
      (pQVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppAVar5 = (pQVar8->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppAVar5 == (pointer)0x0) {
        std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                  ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar8->_aggregates,
                   (iterator)0x0,&local_118);
      }
      else {
        *ppAVar5 = local_118;
        pppAVar1 = &(pQVar8->_aggregates).
                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppAVar1 = *pppAVar1 + 1;
      }
      pQVar8->_rootID = this->_queryRootIndex[uVar9];
      p_Var3 = (pQVar8->_fVars).super__Base_bitset<2UL>._M_w + uVar11;
      *p_Var3 = *p_Var3 | uVar10;
      QueryCompiler::addQuery
                ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pQVar8);
      local_f0.super__Base_bitset<24UL>._M_w[0] = uVar9;
      local_f0.super__Base_bitset<24UL>._M_w[1] = (_WordT)pQVar8;
      if (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[uVar11] &
          uVar10) == 0) {
        __position._M_current =
             (this->continuousQueries).
             super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        this_00 = local_108;
        if (__position._M_current ==
            (this->continuousQueries).
            super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_001a4d7f;
        (__position._M_current)->first = uVar9;
        (__position._M_current)->second = pQVar8;
        pppVar2 = &(this->continuousQueries).
                   super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + 1;
      }
      else {
        __position._M_current =
             (this->categoricalQueries).
             super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        this_00 = local_100;
        if (__position._M_current ==
            (this->categoricalQueries).
            super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_001a4d7f:
          std::
          vector<std::pair<unsigned_long,Query*>,std::allocator<std::pair<unsigned_long,Query*>>>::
          _M_realloc_insert<std::pair<unsigned_long,Query*>>
                    (this_00,__position,(pair<unsigned_long,_Query_*> *)&local_f0);
        }
        else {
          (__position._M_current)->first = uVar9;
          (__position._M_current)->second = pQVar8;
          pppVar2 = &(this->categoricalQueries).
                     super__Vector_base<std::pair<unsigned_long,_Query_*>,_std::allocator<std::pair<unsigned_long,_Query_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar2 = *pppVar2 + 1;
        }
      }
      this->varToQuery[uVar9] = pQVar8;
    }
    uVar9 = uVar9 + 1;
    if (uVar9 == 100) {
      return;
    }
  } while( true );
}

Assistant:

void KMeans::modelToQueries()
{
    // Count aggregate
    Aggregate* agg = new Aggregate();
    agg->_agg.push_back(prod_bitset());

    // Create count query
    Query* query = new Query();
    query->_aggregates.push_back(agg);
    query->_rootID = _td->_root->_id;
    query->_fVars = clusterVariables;

    _compiler->addQuery(query);        
    countQuery = query;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var) 
    {
        if (!_isFeature[var])
            continue;

        // Categorical variable
        Aggregate* agg = new Aggregate();
        agg->_agg.push_back(prod_bitset());

        // Create a query & Aggregate
        Query* query = new Query();
        query->_aggregates.push_back(agg);
        query->_rootID = _queryRootIndex[var];
        query->_fVars.set(var);

        _compiler->addQuery(query);
        
        if (_isCategoricalFeature[var])
        {
            // Categorical variable
            categoricalQueries.push_back({var,query});
        }
        else
        {
            // Continuous variable
            continuousQueries.push_back({var,query});
        }

        varToQuery[var] = query;
    }
}